

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptorProto::MergeFrom
          (ServiceDescriptorProto *this,ServiceDescriptorProto *from)

{
  uint uVar1;
  ServiceOptions *in_RSI;
  ServiceDescriptorProto *in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff18;
  ServiceDescriptorProto *in_stack_ffffffffffffff20;
  ServiceDescriptorProto *this_00;
  string *in_stack_ffffffffffffff38;
  ServiceOptions *in_stack_ffffffffffffff98;
  
  this_00 = (ServiceDescriptorProto *)&in_RSI->_extensions_;
  if (((uint)((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               *)&((ExtensionSet *)this_00)->arena_)->ptr_ & 1) == 1) {
    if (((uint)((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 *)&((ExtensionSet *)this_00)->arena_)->ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
      in_stack_ffffffffffffff20 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff20 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  RepeatedPtrField<google::protobuf::MethodDescriptorProto>::MergeFrom
            ((RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)in_stack_ffffffffffffff20,
             (RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)in_stack_ffffffffffffff18)
  ;
  uVar1 = ((HasBits<1UL> *)&(in_RSI->_extensions_).flat_capacity_)->has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_name_abi_cxx11_((ServiceDescriptorProto *)0x5245d5);
      _internal_set_name(in_RDI,in_stack_ffffffffffffff38);
    }
    if ((uVar1 & 2) != 0) {
      _internal_mutable_options(in_stack_ffffffffffffff20);
      _internal_options((ServiceDescriptorProto *)in_RSI);
      ServiceOptions::MergeFrom(in_RSI,in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

void ServiceDescriptorProto::MergeFrom(const ServiceDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ServiceDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  method_.MergeFrom(from.method_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::ServiceOptions::MergeFrom(from._internal_options());
    }
  }
}